

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_> *
winmd::reader::parse_cmods
          (vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
           *__return_storage_ptr__,table_base *table,byte_view *data)

{
  ElementType local_39;
  undefined1 auStack_38 [7];
  ElementType element_type;
  byte_view cursor;
  byte_view *data_local;
  table_base *table_local;
  vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_> *result;
  
  cursor.m_last._7_1_ = 0;
  data_local = (byte_view *)table;
  table_local = (table_base *)__return_storage_ptr__;
  cppwinrt::std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>::
  vector(__return_storage_ptr__);
  _auStack_38 = data->m_first;
  cursor.m_first = data->m_last;
  local_39 = uncompress_enum<winmd::reader::ElementType>((byte_view *)auStack_38);
  while (local_39 == CModOpt || local_39 == CModReqd) {
    std::vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>>::
    emplace_back<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
              ((vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>> *)
               __return_storage_ptr__,(table_base **)&data_local,data);
    _auStack_38 = data->m_first;
    cursor.m_first = data->m_last;
    local_39 = uncompress_enum<winmd::reader::ElementType>((byte_view *)auStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<CustomModSig> parse_cmods(table_base const* table, byte_view& data)
    {
        std::vector<CustomModSig> result;
        auto cursor = data;

        for (auto element_type = uncompress_enum<ElementType>(cursor);
            element_type == ElementType::CModOpt || element_type == ElementType::CModReqd;
            element_type = uncompress_enum<ElementType>(cursor))
        {
            result.emplace_back(table, data);
            cursor = data;
        }
        return result;
    }